

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu383.c
# Opt level: O0

MPP_RET vdpu383_av1d_start(void *hal,HalTaskInfo *task)

{
  long *plVar1;
  MppDev ctx;
  MPP_RET MVar2;
  long local_68;
  long local_60;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  MppDev dev;
  Vdpu383Av1dRegSet *regs;
  Vdpu383Av1dRegCtx *reg_ctx;
  Av1dHalCtx *p_hal;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  if (hal == (void *)0x0) {
    if ((hal_av1d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_av1d_vdpu383","input empty(%d).\n",(char *)0x0,0x9b4);
    }
  }
  else if ((((task->dec).flags.val >> 2 & 1) == 0) && (((task->dec).flags.val >> 3 & 1) == 0)) {
    plVar1 = *(long **)((long)hal + 0x50);
    if (*(int *)((long)hal + 0x58) == 0) {
      local_68 = *plVar1;
    }
    else {
      local_68 = plVar1[(long)(task->dec).reg_index * 2 + 3];
    }
    ctx = *(MppDev *)((long)hal + 0x48);
    rd_cfg._8_8_ = local_68 + 4;
    MVar2 = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
    if (MVar2 == MPP_OK) {
      rd_cfg._8_8_ = local_68 + 0x60;
      MVar2 = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
      if (MVar2 == MPP_OK) {
        rd_cfg._8_8_ = local_68 + 0xe8;
        MVar2 = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
        if (MVar2 == MPP_OK) {
          rd_cfg._8_8_ = local_68 + 0x194;
          MVar2 = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
          if (MVar2 == MPP_OK) {
            local_60 = local_68 + 0x20;
            rd_cfg.reg._0_4_ = 4;
            rd_cfg.reg._4_4_ = 0x3c;
            MVar2 = mpp_dev_ioctl(ctx,5,&local_60);
            if (MVar2 == MPP_OK) {
              vdpu383_set_rcbinfo(ctx,(Vdpu383RcbInfo *)((long)plVar1 + 100));
              MVar2 = mpp_dev_ioctl(ctx,0xf,(void *)0x0);
              if (MVar2 != MPP_OK) {
                _mpp_log_l(2,"hal_av1d_vdpu383","send cmd failed %d\n","vdpu383_av1d_start",
                           (ulong)(uint)MVar2);
              }
            }
            else {
              _mpp_log_l(2,"hal_av1d_vdpu383","set register read failed %d\n","vdpu383_av1d_start",
                         (ulong)(uint)MVar2);
            }
          }
          else {
            _mpp_log_l(2,"hal_av1d_vdpu383","set register write failed %d\n","vdpu383_av1d_start",
                       (ulong)(uint)MVar2);
          }
        }
        else {
          _mpp_log_l(2,"hal_av1d_vdpu383","set register write failed %d\n","vdpu383_av1d_start",
                     (ulong)(uint)MVar2);
        }
      }
      else {
        _mpp_log_l(2,"hal_av1d_vdpu383","set register write failed %d\n","vdpu383_av1d_start",
                   (ulong)(uint)MVar2);
      }
    }
    else {
      _mpp_log_l(2,"hal_av1d_vdpu383","set register write failed %d\n","vdpu383_av1d_start",
                 (ulong)(uint)MVar2);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu383_av1d_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;
    INP_CHECK(ret, NULL == p_hal);
    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err) {
        goto __RETURN;
    }

    Vdpu383Av1dRegCtx *reg_ctx = (Vdpu383Av1dRegCtx *)p_hal->reg_ctx;
    Vdpu383Av1dRegSet *regs = p_hal->fast_mode ?
                              reg_ctx->reg_buf[task->dec.reg_index].regs :
                              reg_ctx->regs;
    MppDev dev = p_hal->dev;
    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &regs->ctrl_regs;
        wr_cfg.size = sizeof(regs->ctrl_regs);
        wr_cfg.offset = OFFSET_CTRL_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->common_addr;
        wr_cfg.size = sizeof(regs->common_addr);
        wr_cfg.offset = OFFSET_COMMON_ADDR_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->av1d_paras;
        wr_cfg.size = sizeof(regs->av1d_paras);
        wr_cfg.offset = OFFSET_AV1D_PARAS_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &regs->av1d_addrs;
        wr_cfg.size = sizeof(regs->av1d_addrs);
        wr_cfg.offset = OFFSET_AV1D_ADDR_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &regs->ctrl_regs.reg15;
        rd_cfg.size = sizeof(regs->ctrl_regs.reg15);
        rd_cfg.offset = OFFSET_INTERRUPT_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        /* rcb info for sram */
        vdpu383_set_rcbinfo(dev, (Vdpu383RcbInfo*)reg_ctx->rcb_buf_info);

        /* send request to hardware */
        ret = mpp_dev_ioctl(dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

__RETURN:
    return ret = MPP_OK;
}